

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_UndefinedFieldType_Test::TestBody
          (ValidationErrorTest_UndefinedFieldType_Test *this)

{
  allocator<char> local_41;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "name: \"foo.proto\" message_type {  name: \"Foo\"  field { name:\"foo\" number:1 label:LABEL_OPTIONAL type_name:\"Bar\" }}"
             ,&local_41);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40,"foo.proto: Foo.foo: TYPE: \"Bar\" is not defined.\n");
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_28,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_40);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, UndefinedFieldType) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  field { name:\"foo\" number:1 label:LABEL_OPTIONAL type_name:\"Bar\" }"
      "}",

      "foo.proto: Foo.foo: TYPE: \"Bar\" is not defined.\n");
}